

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.c++
# Opt level: O0

Request<capnproto_test::capnp::test::TestMoreStuff::MethodWithNullDefaultParams,_capnproto_test::capnp::test::TestMoreStuff::MethodWithNullDefaultResults>
* __thiscall
capnproto_test::capnp::test::TestMoreStuff::Client::methodWithNullDefaultRequest
          (Request<capnproto_test::capnp::test::TestMoreStuff::MethodWithNullDefaultParams,_capnproto_test::capnp::test::TestMoreStuff::MethodWithNullDefaultResults>
           *__return_storage_ptr__,Client *this,Maybe<capnp::MessageSize> *sizeHint)

{
  long lVar1;
  Maybe<capnp::MessageSize> local_38;
  Maybe<capnp::MessageSize> *local_20;
  Maybe<capnp::MessageSize> *sizeHint_local;
  Client *this_local;
  
  lVar1 = *(long *)(*(long *)this + -0x18);
  local_20 = sizeHint;
  sizeHint_local = (Maybe<capnp::MessageSize> *)this;
  this_local = (Client *)__return_storage_ptr__;
  kj::Maybe<capnp::MessageSize>::Maybe(&local_38,sizeHint);
  ::capnp::Capability::Client::
  newCall<capnproto_test::capnp::test::TestMoreStuff::MethodWithNullDefaultParams,capnproto_test::capnp::test::TestMoreStuff::MethodWithNullDefaultResults>
            (__return_storage_ptr__,(Client *)(&this->field_0x0 + lVar1),0xddc70bf9784133cf,0xc,
             &local_38);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_38);
  return __return_storage_ptr__;
}

Assistant:

::capnp::Request< ::capnproto_test::capnp::test::TestMoreStuff::MethodWithNullDefaultParams,  ::capnproto_test::capnp::test::TestMoreStuff::MethodWithNullDefaultResults>
TestMoreStuff::Client::methodWithNullDefaultRequest(::kj::Maybe< ::capnp::MessageSize> sizeHint) {
  return newCall< ::capnproto_test::capnp::test::TestMoreStuff::MethodWithNullDefaultParams,  ::capnproto_test::capnp::test::TestMoreStuff::MethodWithNullDefaultResults>(
      0xddc70bf9784133cfull, 12, sizeHint);
}